

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O2

string * __thiscall
pbrt::RGBColorSpace::ToString_abi_cxx11_(string *__return_storage_ptr__,RGBColorSpace *this)

{
  SquareMatrix<3> *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::Point2<float>const&,pbrt::DenselySampledSpectrum_const&,pbrt::SquareMatrix<3>const&,pbrt::SquareMatrix<3>const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ RGBColorSpace r: %s g: %s b: %s w: %s illuminant: %s RGBToXYZ: %s XYZToRGB: %s ]",
             (char *)this,&this->g,&this->b,&this->w,(Point2<float> *)&this->illuminant,
             (DenselySampledSpectrum *)&this->XYZFromRGB,&this->RGBFromXYZ,in_stack_fffffffffffffff0
            );
  return __return_storage_ptr__;
}

Assistant:

std::string RGBColorSpace::ToString() const {
    return StringPrintf("[ RGBColorSpace r: %s g: %s b: %s w: %s illuminant: "
                        "%s RGBToXYZ: %s XYZToRGB: %s ]",
                        r, g, b, w, illuminant, XYZFromRGB, RGBFromXYZ);
}